

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

int get_tx_size_context(MACROBLOCKD *xd)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long in_RDI;
  int left;
  int above;
  int has_left;
  int has_above;
  int max_tx_high;
  int max_tx_wide;
  TX_SIZE max_tx_size;
  MB_MODE_INFO *left_mbmi;
  MB_MODE_INFO *above_mbmi;
  MB_MODE_INFO *mbmi;
  uint local_44;
  uint local_4;
  
  pbVar2 = *(byte **)(in_RDI + 0x1ed0);
  pbVar3 = *(byte **)(in_RDI + 0x1ec8);
  iVar7 = tx_size_wide[""[*(byte *)**(undefined8 **)(in_RDI + 0x1eb8)]];
  iVar1 = tx_size_high[""[*(byte *)**(undefined8 **)(in_RDI + 0x1eb8)]];
  bVar4 = *(byte *)(in_RDI + 0x1ec0) & 1;
  uVar5 = (uint)(*(byte *)(in_RDI + 0x1ec1) & 1);
  local_4 = (uint)(iVar7 <= (int)(uint)**(byte **)(in_RDI + 0x1fc0));
  local_44 = (uint)(iVar1 <= (int)(uint)**(byte **)(in_RDI + 0x1fc8));
  if ((bVar4 != 0) &&
     (iVar6 = is_inter_block((MB_MODE_INFO *)
                             (ulong)(CONCAT14(*(byte *)(in_RDI + 0x1ec1),local_4) & 0x1ffffffff)),
     iVar6 != 0)) {
    local_4 = (uint)(iVar7 <= (int)(uint)block_size_wide[*pbVar2]);
  }
  if ((uVar5 != 0) && (iVar7 = is_inter_block((MB_MODE_INFO *)CONCAT44(uVar5,local_4)), iVar7 != 0))
  {
    local_44 = (uint)(iVar1 <= (int)(uint)block_size_high[*pbVar3]);
  }
  if ((bVar4 == 0) || (uVar5 == 0)) {
    if (bVar4 == 0) {
      if (uVar5 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = local_44;
      }
    }
  }
  else {
    local_4 = local_4 + local_44;
  }
  return local_4;
}

Assistant:

static inline int get_tx_size_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const TX_SIZE max_tx_size = max_txsize_rect_lookup[mbmi->bsize];
  const int max_tx_wide = tx_size_wide[max_tx_size];
  const int max_tx_high = tx_size_high[max_tx_size];
  const int has_above = xd->up_available;
  const int has_left = xd->left_available;

  int above = xd->above_txfm_context[0] >= max_tx_wide;
  int left = xd->left_txfm_context[0] >= max_tx_high;

  if (has_above)
    if (is_inter_block(above_mbmi))
      above = block_size_wide[above_mbmi->bsize] >= max_tx_wide;

  if (has_left)
    if (is_inter_block(left_mbmi))
      left = block_size_high[left_mbmi->bsize] >= max_tx_high;

  if (has_above && has_left)
    return (above + left);
  else if (has_above)
    return above;
  else if (has_left)
    return left;
  else
    return 0;
}